

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O1

string * cmTrimWhitespace_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  pcVar3 = str._M_str;
  sVar4 = str._M_len;
  bVar8 = sVar4 == 0;
  if (!bVar8) {
    cVar1 = *pcVar3;
    pcVar7 = pcVar3;
    sVar5 = sVar4;
    while (-1 < cVar1) {
      sVar5 = sVar5 - 1;
      iVar2 = isspace((int)cVar1);
      if (iVar2 == 0) break;
      bVar8 = sVar5 == 0;
      if (bVar8) goto LAB_00121733;
      pcVar7 = pcVar7 + 1;
      cVar1 = *pcVar7;
    }
    if (!bVar8) {
      pcVar3 = pcVar3 + sVar4;
      do {
        pcVar6 = pcVar3;
        if (pcVar6[-1] < '\0') break;
        iVar2 = isspace((int)pcVar6[-1]);
        pcVar3 = pcVar6 + -1;
      } while (iVar2 != 0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar7,pcVar6);
      return __return_storage_ptr__;
    }
  }
LAB_00121733:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string cmTrimWhitespace(cm::string_view str)
{
  // XXX(clang-tidy): This declaration and the next cannot be `const auto*`
  // because the qualification of `auto` is platform-dependent.
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto start = str.begin();
  while (start != str.end() && cmIsSpace(*start)) {
    ++start;
  }
  if (start == str.end()) {
    return std::string();
  }
  // NOLINTNEXTLINE(readability-qualified-auto)
  auto stop = str.end() - 1;
  while (cmIsSpace(*stop)) {
    --stop;
  }
  return std::string(start, stop + 1);
}